

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O3

void Qentem::Test::TestRawVariableTag2(QTest *test)

{
  Value<char> *pVVar1;
  char *pcVar2;
  Array<Qentem::Tags::TagBit> tags_cache;
  StringStream<char> stream;
  StringStream<char> ss;
  Value<char> value;
  Array<Qentem::Tags::TagBit> local_98;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> local_88;
  StringStream<char> local_58;
  ValueT local_48;
  
  local_58.storage_ = (char *)0x0;
  local_58.length_ = 0;
  local_58.capacity_ = 0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  JSON::JSONParser<char,_Qentem::StringStream<char>_>::Parse
            (&local_48,(StringStream<char> *)&local_88,"[\"A\", \"abc\", true, 456, 1.5]",0x1c);
  pVVar1 = local_88.value_;
  if (local_88.value_ != (Value<char> *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.value_);
  }
  operator_delete(pVVar1);
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_88.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  local_88.content_ = "{raw:0}{raw:0}";
  local_88.length_ = 0xe;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:0}{raw:0}",0xe,&local_98);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_88,&local_98,&local_48,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,&local_58,(char (*) [3])0x130db9,0x4e0);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_88.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  local_88.content_ = "{raw:1}{raw:0}";
  local_88.length_ = 0xe;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:1}{raw:0}",0xe,&local_98);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_88,&local_98,&local_48,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(test,&local_58,(char (*) [5])"abcA",0x4e4);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_88.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  local_88.content_ = "{raw:1}{raw:2}";
  local_88.length_ = 0xe;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:1}{raw:2}",0xe,&local_98);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_88,&local_98,&local_48,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,&local_58,(char (*) [8])"abctrue",0x4e8);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_88.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  local_88.content_ = "{raw:2}{raw:3}{raw:2}";
  local_88.length_ = 0x15;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:2}{raw:3}{raw:2}",0x15,&local_98);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_88,&local_98,&local_48,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,&local_58,(char (*) [12])"true456true",0x4ec);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_88.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  local_88.content_ = "{raw:4}{raw:4}{raw:4}";
  local_88.length_ = 0x15;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:4}{raw:4}{raw:4}",0x15,&local_98);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_88,&local_98,&local_48,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[10]>
            (test,&local_58,(char (*) [10])"1.51.51.5",0x4f0);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_88.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  local_88.content_ = "{raw:0}-{raw:0}";
  local_88.length_ = 0xf;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:0}-{raw:0}",0xf,&local_98);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_88,&local_98,&local_48,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,&local_58,(char (*) [4])"A-A",0x4f6);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_88.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  local_88.content_ = "{raw:1}--{raw:0}";
  local_88.length_ = 0x10;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:1}--{raw:0}",0x10,&local_98);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_88,&local_98,&local_48,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,&local_58,(char (*) [7])"abc--A",0x4fa);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_88.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  local_88.content_ = "{raw:1}---{raw:2}";
  local_88.length_ = 0x11;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:1}---{raw:2}",0x11,&local_98);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_88,&local_98,&local_48,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>
            (test,&local_58,(char (*) [11])"abc---true",0x4fe);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_88.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  local_88.content_ = "{raw:2}{raw:3}--{raw:2}";
  local_88.length_ = 0x17;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:2}{raw:3}--{raw:2}",0x17,&local_98);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_88,&local_98,&local_48,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,&local_58,(char (*) [14])"true456--true",0x502);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_88.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  local_88.content_ = "{raw:4}--{raw:4}{raw:4}";
  local_88.length_ = 0x17;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:4}--{raw:4}{raw:4}",0x17,&local_98);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_88,&local_98,&local_48,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,&local_58,(char (*) [12])"1.5--1.51.5",0x506);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_88.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  local_88.content_ = "{raw:4}--{raw:4}--{raw:4}";
  local_88.length_ = 0x19;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:4}--{raw:4}--{raw:4}",0x19,&local_98);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_88,&local_98,&local_48,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,&local_58,(char (*) [14])"1.5--1.5--1.5",0x50a);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  local_88.loops_items_ =
       (Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
        *)0x0;
  local_98.storage_ = (TagBit *)0x0;
  local_98.index_ = 0;
  local_98.capacity_ = 0;
  local_88.value_ = (Value<char> *)0x0;
  local_88.stream_ = (StringStream<char> *)0x0;
  local_88.content_ = "{raw:4}---{raw:4}---{raw:4}";
  local_88.length_ = 0x1b;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{raw:4}---{raw:4}---{raw:4}",0x1b,&local_98);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            (&local_88,&local_98,&local_48,&local_58);
  Array<Qentem::Tags::TagBit>::~Array(&local_98);
  QTest::IsEqual<Qentem::StringStream<char>,char[16]>
            (test,&local_58,(char (*) [16])"1.5---1.5---1.5",0x50e);
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  Value<char>::~Value(&local_48);
  pcVar2 = local_58.storage_;
  if (local_58.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.storage_);
  }
  operator_delete(pcVar2);
  return;
}

Assistant:

static void TestRawVariableTag2(QTest &test) {
    StringStream<char> ss;
    const Value<char>  value = JSON::Parse(R"(["A", "abc", true, 456, 1.5])");
    const char        *content;

    content = R"({raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(AA)", __LINE__);
    ss.Clear();

    content = R"({raw:1}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(abcA)", __LINE__);
    ss.Clear();

    content = R"({raw:1}{raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"(abctrue)", __LINE__);
    ss.Clear();

    content = R"({raw:2}{raw:3}{raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"(true456true)", __LINE__);
    ss.Clear();

    content = R"({raw:4}{raw:4}{raw:4})";
    test.IsEqual(Template::Render(content, value, ss), R"(1.51.51.5)", __LINE__);
    ss.Clear();

    ///

    content = R"({raw:0}-{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(A-A)", __LINE__);
    ss.Clear();

    content = R"({raw:1}--{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(abc--A)", __LINE__);
    ss.Clear();

    content = R"({raw:1}---{raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"(abc---true)", __LINE__);
    ss.Clear();

    content = R"({raw:2}{raw:3}--{raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"(true456--true)", __LINE__);
    ss.Clear();

    content = R"({raw:4}--{raw:4}{raw:4})";
    test.IsEqual(Template::Render(content, value, ss), R"(1.5--1.51.5)", __LINE__);
    ss.Clear();

    content = R"({raw:4}--{raw:4}--{raw:4})";
    test.IsEqual(Template::Render(content, value, ss), R"(1.5--1.5--1.5)", __LINE__);
    ss.Clear();

    content = R"({raw:4}---{raw:4}---{raw:4})";
    test.IsEqual(Template::Render(content, value, ss), R"(1.5---1.5---1.5)", __LINE__);
    ss.Clear();
}